

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::DrawInstancedGeometryInstancedCase::init
          (DrawInstancedGeometryInstancedCase *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *this_00;
  int iVar2;
  ShaderProgram *this_01;
  ShaderProgramDeclaration *pSVar3;
  ostream *poVar4;
  EVP_PKEY_CTX *ctx_00;
  ostringstream buf;
  ContextType local_454;
  string local_450;
  FragmentSource local_430;
  VertexSource local_410;
  long *local_3f0;
  undefined8 local_3e8;
  long local_3e0;
  undefined1 local_3d8;
  long *local_3d0;
  undefined8 local_3c8;
  long local_3c0;
  undefined2 local_3b8;
  undefined1 local_3b6;
  FragmentOutput local_3ac;
  VertexAttribute local_3a8;
  VertexAttribute local_380;
  string local_358;
  GeometrySource local_338;
  string local_318;
  string local_2f8;
  undefined1 local_2d8 [120];
  ios_base local_260 [264];
  GeometryShaderDeclaration local_158;
  ShaderProgramDeclaration local_140;
  
  this_01 = (ShaderProgram *)operator_new(0x158);
  local_454.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  iVar2 = this->m_numInvocations;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_3d0 = &local_3c0;
  local_3c0 = 0x697469736f705f61;
  local_3b8 = 0x6e6f;
  local_3c8 = 10;
  local_3b6 = 0;
  local_380.name._M_dataplus._M_p = (pointer)&local_380.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_380);
  local_380.type = GENERICVECTYPE_FLOAT;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_380);
  local_3f0 = &local_3e0;
  local_3e0 = 0x74657366666f5f61;
  local_3e8 = 8;
  local_3d8 = 0;
  local_3a8.name._M_dataplus._M_p = (pointer)&local_3a8.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_3a8);
  local_3a8.type = GENERICVECTYPE_FLOAT;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_3a8);
  local_3ac.type = GENERICVECTYPE_FLOAT;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_3ac);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2d8,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_offset;\nvoid main (void)\n{\n\tgl_Position = a_position + a_offset;\n}\n"
             ,0x82);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_2f8,&local_450,&local_454);
  paVar1 = &local_450.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != paVar1) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
  std::ios_base::~ios_base((ios_base *)(local_2d8 + 0x70));
  local_410.source._M_dataplus._M_p = (pointer)&local_410.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_410,local_2f8._M_dataplus._M_p,
             local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_410);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2d8,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
             ,0x82);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_318,&local_450,&local_454);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != paVar1) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
  std::ios_base::~ios_base((ios_base *)(local_2d8 + 0x70));
  local_430.source._M_dataplus._M_p = (pointer)&local_430.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_430,local_318._M_dataplus._M_p,
             local_318._M_dataplus._M_p + local_318._M_string_length);
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_430);
  local_158.numInvocations = (size_t)iVar2;
  local_158.inputType = GEOMETRYSHADERINPUTTYPE_POINTS;
  local_158.outputType = GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP;
  local_158.numOutputVertices = 4;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_158);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2d8,
             "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(points,invocations=",0x4a);
  poVar4 = (ostream *)std::ostream::operator<<(local_2d8,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             ") in;\nlayout(triangle_strip, max_vertices = 3) out;\n\nvoid main (void)\n{\n\thighp vec4 basePosition = gl_in[0].gl_Position;\n\thighp float phase = float(gl_InvocationID) / float("
             ,0xad);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             ") * 6.3;\n\thighp vec4 centerPosition = basePosition + 0.1 * vec4(cos(phase), sin(phase), 0.0, 0.0);\n\n\tgl_Position = centerPosition + vec4( 0.00, -0.1, 0.0, 0.0);\n\tEmitVertex();\n\tgl_Position = centerPosition + vec4(-0.05,  0.0, 0.0, 0.0);\n\tEmitVertex();\n\tgl_Position = centerPosition + vec4( 0.05,  0.0, 0.0, 0.0);\n\tEmitVertex();\n}\n"
             ,0x14a);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_358,&local_450,&local_454);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != paVar1) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
  std::ios_base::~ios_base((ios_base *)(local_2d8 + 0x70));
  paVar1 = &local_338.source.field_2;
  local_338.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_338,local_358._M_dataplus._M_p,
             local_358._M_dataplus._M_p + local_358._M_string_length);
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_338);
  sglr::ShaderProgram::ShaderProgram(this_01,pSVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338.source._M_dataplus._M_p != paVar1) {
    operator_delete(local_338.source._M_dataplus._M_p,
                    local_338.source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430.source._M_dataplus._M_p != &local_430.source.field_2) {
    operator_delete(local_430.source._M_dataplus._M_p,
                    local_430.source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410.source._M_dataplus._M_p != &local_410.source.field_2) {
    operator_delete(local_410.source._M_dataplus._M_p,
                    local_410.source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.name._M_dataplus._M_p != &local_3a8.name.field_2) {
    operator_delete(local_3a8.name._M_dataplus._M_p,local_3a8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,local_3e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.name._M_dataplus._M_p != &local_380.name.field_2) {
    operator_delete(local_380.name._M_dataplus._M_p,local_380.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0,local_3c0 + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this_01->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00b46a10;
  (this_01->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&DAT_00b46a48;
  (this_01->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_00b46a60;
  *(int *)&this_01->field_0x154 = iVar2;
  this->m_program = (InstancedExpansionShader *)this_01;
  local_2d8._0_8_ =
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_2d8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Rendering a single point with ",0x1e);
  std::ostream::operator<<(this_00,this->m_numInstances);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," instances. ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Each geometry shader is invoked ",0x20);
  std::ostream::operator<<(this_00,this->m_numInvocations);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," times for each primitive. ",0x1b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_260);
  iVar2 = GeometryShaderRenderTest::init(&this->super_GeometryShaderRenderTest,ctx_00);
  return iVar2;
}

Assistant:

void DrawInstancedGeometryInstancedCase::init (void)
{
	m_program = new InstancedExpansionShader(m_context.getRenderContext().getType(), m_numInvocations);

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering a single point with " << m_numInstances << " instances. "
		<< "Each geometry shader is invoked " << m_numInvocations << " times for each primitive. "
		<< tcu::TestLog::EndMessage;

	GeometryShaderRenderTest::init();
}